

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::
markRenderTextureBufferUpdated(ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_stack_00000040;
  
  checkDeviceBufferTypeIsTexture(in_stack_00000040);
  invalidateHostBuffer((ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)0x4311d2);
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::markRenderTextureBufferUpdated() {
  checkDeviceBufferTypeIsTexture();

  invalidateHostBuffer();
  requestRedraw();
}